

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgidm(fitsfile *fptr,int *naxis,int *status)

{
  int iVar1;
  int *in_RDX;
  undefined4 *in_RSI;
  int *in_RDI;
  int *in_stack_00000040;
  int *in_stack_00000048;
  int in_stack_00000054;
  fitsfile *in_stack_00000058;
  int *in_stack_000000e0;
  fitsfile *in_stack_000000e8;
  int local_4;
  
  if (*in_RDX < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_000000e8,in_stack_000000e0), 0 < iVar1)) {
        return *in_RDX;
      }
    }
    else {
      ffmahd(in_stack_00000058,in_stack_00000054,in_stack_00000048,in_stack_00000040);
    }
    if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
      *in_RSI = *(undefined4 *)(*(long *)(in_RDI + 2) + 0x90);
    }
    else if (*(int *)(*(long *)(in_RDI + 2) + 0x47c) == 0) {
      *in_RDX = 0xe9;
    }
    else {
      *in_RSI = *(undefined4 *)(*(long *)(in_RDI + 2) + 0x490);
    }
    local_4 = *in_RDX;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffgidm( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  *naxis  ,   /* O - image dimension (NAXIS value)           */
            int  *status)    /* IO - error status                           */
/*
  Get the dimension of the image (= NAXIS keyword for normal image, or
  ZNAXIS for a compressed image)
  These values are cached for faster access.
*/
{
    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        *naxis = (fptr->Fptr)->imgdim;
    }
    else if ((fptr->Fptr)->compressimg)
    {
        *naxis = (fptr->Fptr)->zndim;
    }
    else
    {
        *status = NOT_IMAGE;
    }

    return(*status);
}